

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZGeoElSidePartition>::Resize(TPZVec<TPZGeoElSidePartition> *this,int64_t newsize)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  TPZGeoElSidePartition *pTVar3;
  undefined1 auVar4 [16];
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t *piVar8;
  long lVar9;
  long lVar10;
  TPZVec<TPZGeoElSidePartition> *this_00;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar3 = this->fStore;
      if (pTVar3 != (TPZGeoElSidePartition *)0x0) {
        lVar10 = pTVar3[-1].fPartition.fNAlloc;
        if (lVar10 != 0) {
          lVar9 = lVar10 * 0x38;
          do {
            TPZGeoElSidePartition::~TPZGeoElSidePartition
                      ((TPZGeoElSidePartition *)
                       ((long)&pTVar3[-1].fCurrent.super_TPZSavable._vptr_TPZSavable + lVar9));
            lVar9 = lVar9 + -0x38;
          } while (lVar9 != 0);
        }
        operator_delete__(&pTVar3[-1].fPartition.fNAlloc,lVar10 * 0x38 + 8);
      }
      this->fStore = (TPZGeoElSidePartition *)0x0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = newsize;
      uVar6 = SUB168(auVar4 * ZEXT816(0x38),0);
      uVar7 = uVar6 + 8;
      if (0xfffffffffffffff7 < uVar6) {
        uVar7 = 0xffffffffffffffff;
      }
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
        uVar6 = uVar7;
      }
      piVar8 = (int64_t *)operator_new__(uVar6);
      *piVar8 = newsize;
      lVar9 = 0;
      do {
        *(undefined ***)((long)piVar8 + lVar9 + 8) = &PTR__TPZGeoElSide_01920090;
        *(undefined8 *)((long)piVar8 + lVar9 + 0x10) = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x18) = 0xffffffff;
        *(undefined ***)((long)piVar8 + lVar9 + 0x20) = &PTR__TPZVec_01920ce0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)piVar8 + lVar9 + 0x38) = 0;
        lVar9 = lVar9 + 0x38;
      } while (newsize * 0x38 - lVar9 != 0);
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      if (0 < lVar10) {
        this_00 = (TPZVec<TPZGeoElSidePartition> *)(piVar8 + 4);
        lVar9 = 0x10;
        do {
          puVar2 = (undefined4 *)
                   ((long)&(this->fStore->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar9);
          *(undefined4 *)&this_00[-1].fNAlloc = *puVar2;
          this_00[-1].fNElements = *(int64_t *)(puVar2 + -2);
          operator=(this_00,(TPZVec<TPZGeoElSidePartition> *)(puVar2 + 2));
          this_00 = (TPZVec<TPZGeoElSidePartition> *)&this_00[1].fNAlloc;
          lVar9 = lVar9 + 0x38;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pTVar3 = this->fStore;
      if (pTVar3 != (TPZGeoElSidePartition *)0x0) {
        lVar10 = pTVar3[-1].fPartition.fNAlloc;
        if (lVar10 != 0) {
          lVar9 = lVar10 * 0x38;
          do {
            TPZGeoElSidePartition::~TPZGeoElSidePartition
                      ((TPZGeoElSidePartition *)
                       ((long)&pTVar3[-1].fCurrent.super_TPZSavable._vptr_TPZSavable + lVar9));
            lVar9 = lVar9 + -0x38;
          } while (lVar9 != 0);
        }
        operator_delete__(&pTVar3[-1].fPartition.fNAlloc,lVar10 * 0x38 + 8);
      }
      this->fStore = (TPZGeoElSidePartition *)(piVar8 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}